

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitReplaceLaneExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType type;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WasmRegisterSpace *this_00;
  EmitInfo EVar4;
  EmitInfo local_48;
  EmitInfo indexInfo;
  EmitInfo local_38;
  EmitInfo valueArg;
  
  type = *signature;
  local_38 = PopEvalStack(this,signature[1],L"lane argument type mismatch");
  indexInfo = PopEvalStack(this,V128,L"simd argument type mismatch");
  if (type != V128) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x5fa,"(resultType == WasmTypes::V128)","resultType == WasmTypes::V128");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = EmitLaneIndex(this,op);
  this_00 = GetRegisterSpace(this,type);
  EVar4.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x11])
            (this->m_writer,(ulong)op,(ulong)EVar4.super_EmitInfoBase.location,indexInfo,
             (ulong)local_48 & 0xffffffff,(ulong)local_38 & 0xffffffff);
  ReleaseLocation(this,&local_48);
  ReleaseLocation(this,&local_38);
  EVar4.type = type;
  return EVar4;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitReplaceLaneExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature) {

    const WasmTypes::WasmType resultType = signature[0];
    const WasmTypes::WasmType valueType = signature[1];
    EmitInfo valueArg = PopEvalStack(valueType, _u("lane argument type mismatch"));

    EmitInfo simdArg = PopEvalStack(WasmTypes::V128, _u("simd argument type mismatch"));
    Assert(resultType == WasmTypes::V128);

    EmitInfo indexInfo = EmitLaneIndex(op);
    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();
    EmitInfo result(resultReg, resultType);

    m_writer->AsmReg4(op, resultReg, simdArg.location, indexInfo.location, valueArg.location);
    ReleaseLocation(&indexInfo);
    ReleaseLocation(&valueArg);
    return result;
}